

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_init.c
# Opt level: O3

void luaL_openlibs(lua_State *L)

{
  code *f;
  luaL_Reg *plVar1;
  
  plVar1 = lj_lib_load;
  f = luaopen_base;
  do {
    lua_pushcclosure(L,f,0);
    f = plVar1[1].func;
    lua_pushstring(L,plVar1->name);
    lua_call(L,1,0);
    plVar1 = plVar1 + 1;
  } while (f != (lua_CFunction)0x0);
  luaL_findtable(L,-10000,"_PRELOAD",1);
  lua_pushcclosure(L,luaopen_ffi,0);
  lua_setfield(L,-2,"ffi");
  lua_settop(L,-2);
  return;
}

Assistant:

LUALIB_API void luaL_openlibs(lua_State *L)
{
  const luaL_Reg *lib;
  for (lib = lj_lib_load; lib->func; lib++) {
    lua_pushcfunction(L, lib->func);
    lua_pushstring(L, lib->name);
    lua_call(L, 1, 0);
  }
  luaL_findtable(L, LUA_REGISTRYINDEX, "_PRELOAD",
		 sizeof(lj_lib_preload)/sizeof(lj_lib_preload[0])-1);
  for (lib = lj_lib_preload; lib->func; lib++) {
    lua_pushcfunction(L, lib->func);
    lua_setfield(L, -2, lib->name);
  }
  lua_pop(L, 1);
}